

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirements
          (TrimCapabilitiesPass *this,Instruction *instruction,CapabilitySet *capabilities,
          ExtensionSet *extensions)

{
  Op opcode;
  pointer pOVar1;
  ulong uVar2;
  _Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
  _Var3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  _Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>
  __tmp;
  bool bVar8;
  pair<std::__detail::_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_false,_true>_>
  pVar9;
  optional<spv::Capability> result;
  undefined8 local_58;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  
  opcode = instruction->opcode_;
  if ((opcode != OpExtension) && (opcode != OpCapability)) {
    if (opcode == OpExtInst) {
      addInstructionRequirementsForExtInst(this,instruction,capabilities);
    }
    else {
      addInstructionRequirementsForOpcode(this,opcode,capabilities,extensions);
    }
    iVar7 = (int)((long)(instruction->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(instruction->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x55555555;
    if (iVar7 != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        pOVar1 = (instruction->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = ((long)(instruction->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
                -0x5555555555555555;
        if (uVar2 < uVar6 || uVar2 - uVar6 == 0) {
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
        }
        addInstructionRequirementsForOperand
                  (this,(Operand *)((long)((pOVar1->words).buffer + 0xfffffffffffffffa) + lVar5),
                   capabilities,extensions);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x30;
      } while (iVar7 != (int)uVar6);
    }
    local_50.first.set_._0_4_ = instruction->opcode_;
    pVar9 = std::
            _Hashtable<spv::Op,_std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_std::allocator<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ClassEnumHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::equal_range(&(this->opcodeHandlers_)._M_h,(key_type *)&local_50);
    _Var3._M_cur = (__node_type *)
                   pVar9.first.
                   super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                   ._M_cur;
    if ((_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
         )_Var3._M_cur !=
        pVar9.second.
        super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
       ) {
      do {
        uVar4 = (**(code **)((long)&((_Var3._M_cur)->
                                    super__Hash_node_value<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>_>
                                    ._M_storage._M_storage + 8))(instruction);
        local_58._4_1_ = (char)((ulong)uVar4 >> 0x20);
        bVar8 = local_58._4_1_ == '\x01';
        local_58 = uVar4;
        if (bVar8) {
          EnumSet<spv::Capability>::insert(&local_50,capabilities,(Capability *)&local_58);
        }
        _Var3._M_cur = (__node_type *)((_Var3._M_cur)->super__Hash_node_base)._M_nxt;
      } while ((_Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
                )_Var3._M_cur !=
               pVar9.second.
               super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_spv::Op,_std::optional<spv::Capability>_(*)(const_spvtools::opt::Instruction_*)>,_true>
              );
    }
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::addInstructionRequirements(
    Instruction* instruction, CapabilitySet* capabilities,
    ExtensionSet* extensions) const {
  // Ignoring OpCapability and OpExtension instructions.
  if (instruction->opcode() == spv::Op::OpCapability ||
      instruction->opcode() == spv::Op::OpExtension) {
    return;
  }

  if (instruction->opcode() == spv::Op::OpExtInst) {
    addInstructionRequirementsForExtInst(instruction, capabilities);
  } else {
    addInstructionRequirementsForOpcode(instruction->opcode(), capabilities,
                                        extensions);
  }

  // Second case: one of the opcode operand is gated by a capability.
  const uint32_t operandCount = instruction->NumOperands();
  for (uint32_t i = 0; i < operandCount; i++) {
    addInstructionRequirementsForOperand(instruction->GetOperand(i),
                                         capabilities, extensions);
  }

  // Last case: some complex logic needs to be run to determine capabilities.
  auto[begin, end] = opcodeHandlers_.equal_range(instruction->opcode());
  for (auto it = begin; it != end; it++) {
    const OpcodeHandler handler = it->second;
    auto result = handler(instruction);
    if (!result.has_value()) {
      continue;
    }

    capabilities->insert(*result);
  }
}